

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

void http_parser_pause_(http_parser *parser,int paused)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = parser->field_0x17;
  if (((bVar1 & 0x7f) != 0x1c) && ((bVar1 & 0x7f) != 0)) {
    __assert_fail("0 && \"Attempting to pause parser in error state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                  ,0x881,"void http_parser_pause_(http_parser *, int)");
  }
  bVar2 = 0x1c;
  if (paused == 0) {
    bVar2 = 0;
  }
  parser->field_0x17 = bVar1 & 0x80 | bVar2;
  return;
}

Assistant:

void
http_parser_pause_(http_parser *parser, int paused) {
  /* Users should only be pausing/unpausing a parser that is not in an error
   * state. In non-debug builds, there's not much that we can do about this
   * other than ignore it.
   */
  if (HTTP_PARSER_ERRNO(parser) == HPE_OK ||
      HTTP_PARSER_ERRNO(parser) == HPE_PAUSED) {
    SET_ERRNO((paused) ? HPE_PAUSED : HPE_OK);
  } else {
    assert(0 && "Attempting to pause parser in error state");
  }
}